

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageRotateCCW(Image *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  int iVar12;
  void *pvVar13;
  int x;
  ulong uVar14;
  int i;
  ulong uVar15;
  int iVar16;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (10 < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar5 = GetPixelDataSize(1,1,image->format);
    uVar3 = image->width;
    uVar4 = image->height;
    pvVar6 = malloc((long)(int)(uVar3 * uVar5 * uVar4));
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
    }
    uVar9 = 0;
    if (0 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    uVar10 = 0;
    if (0 < (int)uVar4) {
      uVar10 = (ulong)uVar4;
    }
    iVar16 = (uVar3 - 1) * uVar5;
    pvVar11 = pvVar6;
    while (uVar7 != uVar10) {
      uVar7 = uVar7 + 1;
      pvVar13 = pvVar11;
      iVar12 = iVar16;
      for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
        for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined1 *)((long)pvVar13 + uVar15) =
               *(undefined1 *)((long)image->data + uVar15 + (long)iVar12);
        }
        pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar4 * (long)(int)uVar5);
        iVar12 = iVar12 - uVar5;
      }
      pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar5);
      iVar16 = iVar16 + uVar3 * uVar5;
    }
    free(image->data);
    image->data = pvVar6;
    uVar1 = image->width;
    uVar2 = image->height;
    image->width = uVar2;
    image->height = uVar1;
  }
  return;
}

Assistant:

void ImageRotateCCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + y))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - x - 1))*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + y)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - x - 1))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}